

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugger.cxx
# Opt level: O2

watchpoint_id __thiscall
cmDebugger_impl::SetWatchpoint(cmDebugger_impl *this,string *expr,WatchpointType watchpointType)

{
  watchpoint_id wVar1;
  __shared_ptr<cmDebugger_impl::Watchpoint,_(__gnu_cxx::_Lock_policy)2> *__r;
  Watchpoint *this_00;
  __weak_ptr<cmDebugger_impl::Watchpoint,(__gnu_cxx::_Lock_policy)2> *this_01;
  watchpoint_id nextId;
  
  std::mutex::lock(&this->breakpointMutex);
  wVar1 = this->nextBreakId;
  this->nextBreakId = wVar1 + 1;
  nextId = wVar1;
  __r = (__shared_ptr<cmDebugger_impl::Watchpoint,_(__gnu_cxx::_Lock_policy)2> *)operator_new(0x10);
  this_00 = (Watchpoint *)operator_new(0x40);
  Watchpoint::Watchpoint(this_00,this,wVar1,watchpointType,expr);
  std::__shared_ptr<cmDebugger_impl::Watchpoint,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<cmDebugger_impl::Watchpoint,void>
            ((__shared_ptr<cmDebugger_impl::Watchpoint,(__gnu_cxx::_Lock_policy)2> *)__r,this_00);
  __r->_M_ptr->user_data = __r;
  this_01 = (__weak_ptr<cmDebugger_impl::Watchpoint,(__gnu_cxx::_Lock_policy)2> *)
            std::
            map<unsigned_long,_std::weak_ptr<cmDebugger_impl::Watchpoint>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::weak_ptr<cmDebugger_impl::Watchpoint>_>_>_>
            ::operator[](&this->activeWatchpoints,&nextId);
  std::__weak_ptr<cmDebugger_impl::Watchpoint,(__gnu_cxx::_Lock_policy)2>::operator=(this_01,__r);
  cmVariableWatch::AddWatch
            (this->CMakeInstance->VariableWatch,expr,WatchMethodCB,__r,WatchMethodDelete);
  wVar1 = nextId;
  pthread_mutex_unlock((pthread_mutex_t *)&this->breakpointMutex);
  return wVar1;
}

Assistant:

watchpoint_id SetWatchpoint(
    const std::string& expr,
    cmWatchpoint::WatchpointType watchpointType) override
  {
    // The pointer to a smart pointer mechanism isn't pretty, but it should be
    // safe.The idea is that we store away the control block into
    // activeWatchpoints as a weak ptr; and so if the VariableWatch is
    // destroyed first, the weak ptr just goes stale. If the debugger is
    // destroyed first, the weak_ptrs must still be valid, so in the
    // debugger_impl dtor we clear the debugger on all still-valid watchpoints,
    // and the watchpoint callback is a noop if the debugger field isn't set.

    // NOTE: This means we are safe for either order, but is still isn't thread
    // safe -- you can hit a race condition if you delete the cmVariableWatch
    // and the cmDebugger simultaneously in different threads. Since these
    // objects are both dtored in the main thread, this shouldn't be an issue.
    std::lock_guard<std::mutex> l(breakpointMutex);
    watchpoint_id nextId = nextBreakId++;
    auto watch =
      new Watchpoint::ptr(new Watchpoint(this, nextId, watchpointType, expr));

    // Looks odd for sure but we need to store away user_data we hand off to
    // AddWatch so we can remove the watch later on
    (*watch)->user_data = watch;
    activeWatchpoints[nextId] = *watch;

    this->CMakeInstance.GetVariableWatch()->AddWatch(expr, WatchMethodCB,
                                                     watch, WatchMethodDelete);
    return nextId;
  }